

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::IsNull(Var instance,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if ((bVar2) &&
     (*(JavascriptLibrary **)(*(long *)(*(long *)(*(long *)((long)instance + 8) + 8) + 0x490) + 8)
      != library)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2b28,
                                "(!VarIs<RecyclableObject>(instance) ? 1 : ((RecyclableObject*)instance)->GetScriptContext()->GetLibrary() == library)"
                                ,
                                "!VarIs<RecyclableObject>(instance) ? TRUE : ((RecyclableObject*)instance)->GetScriptContext()->GetLibrary() == library"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (BOOL)((library->super_JavascriptLibraryBase).nullValue.ptr == (RecyclableObject *)instance
               );
}

Assistant:

BOOL JavascriptOperators::IsNull(Var instance, JavascriptLibrary* library)
    {
        Assert(!VarIs<RecyclableObject>(instance) ? TRUE : ((RecyclableObject*)instance)->GetScriptContext()->GetLibrary() == library );
        return library->GetNull() == instance;
    }